

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t archive_acl_text_l(archive_acl *acl,wchar_t flags,char **acl_text,size_t *acl_text_len,
                          archive_string_conv *sc)

{
  char *__s;
  archive_acl *paVar1;
  size_t *psVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  size_t sVar5;
  archive_acl_entry *paVar6;
  archive_acl_entry *paVar7;
  int iVar8;
  size_t sVar9;
  char *p;
  char *name;
  size_t len;
  archive_acl *local_58;
  archive_string_conv *local_50;
  char *local_48;
  char **local_40;
  size_t *local_38;
  long lVar10;
  
  if (acl->acl_text != (char *)0x0) {
    free(acl->acl_text);
    acl->acl_text = (char *)0x0;
  }
  *acl_text = (char *)0x0;
  if (acl_text_len != (size_t *)0x0) {
    *acl_text_len = 0;
  }
  paVar7 = (archive_acl_entry *)&acl->acl_head;
  iVar8 = 0;
  sVar9 = 0;
  paVar6 = paVar7;
  local_58 = acl;
  local_50 = sc;
  local_40 = acl_text;
  local_38 = acl_text_len;
  while( true ) {
    paVar6 = paVar6->next;
    if (paVar6 == (archive_acl_entry *)0x0) break;
    wVar4 = paVar6->type;
    if ((wVar4 & flags) != 0) {
      wVar3 = archive_mstring_get_mbs_l(&paVar6->name,&name,&len,local_50);
      if (wVar3 != L'\0') {
        return L'\xffffffff';
      }
      sVar5 = sVar9 + 8;
      if (((uint)wVar4 >> 9 & 1) == 0) {
        sVar5 = sVar9;
      }
      if (((uint)flags >> 0xb & 1) == 0) {
        sVar5 = sVar9;
      }
      iVar8 = iVar8 + 1;
      lVar10 = sVar5 + 6 + len;
      if (name == (char *)0x0) {
        lVar10 = sVar5 + 0x13;
      }
      if (len == 0) {
        lVar10 = sVar5 + 0x13;
      }
      sVar9 = lVar10 + 0x13;
    }
  }
  if (iVar8 != 0) {
    sVar5 = sVar9 + 0x20;
    if (((uint)flags >> 8 & 1) == 0) {
      sVar5 = sVar9;
    }
    p = (char *)malloc(sVar5);
    paVar1 = local_58;
    local_58->acl_text = p;
    if (p == (char *)0x0) {
      return L'\xffffffff';
    }
    if (((uint)flags >> 8 & 1) != 0) {
      append_entry(&p,(char *)0x0,L'✒',(char *)0x0,local_58->mode & 0x1c0,L'\xffffffff');
      *p = ',';
      p = p + 1;
      append_entry(&p,(char *)0x0,L'✔',(char *)0x0,paVar1->mode & 0x38,L'\xffffffff');
      *p = ',';
      p = p + 1;
      append_entry(&p,(char *)0x0,L'✖',(char *)0x0,paVar1->mode & 7,L'\xffffffff');
      paVar6 = paVar7;
      while (paVar6 = paVar6->next, paVar6 != (archive_acl_entry *)0x0) {
        if ((paVar6->type & L'Ā') != L'\0') {
          wVar4 = archive_mstring_get_mbs_l(&paVar6->name,&name,&len,local_50);
          if (wVar4 != L'\0') {
            return L'\xffffffff';
          }
          *p = ',';
          wVar4 = L'\xffffffff';
          if (((uint)flags >> 10 & 1) != 0) {
            wVar4 = paVar6->id;
          }
          p = p + 1;
          append_entry(&p,(char *)0x0,paVar6->tag,name,paVar6->permset,wVar4);
        }
      }
    }
    if (((uint)flags >> 9 & 1) != 0) {
      iVar8 = 0;
      local_48 = (char *)0x0;
      if (((uint)flags >> 0xb & 1) != 0) {
        local_48 = "default:";
      }
      while (paVar7 = paVar7->next, paVar7 != (archive_acl_entry *)0x0) {
        if ((paVar7->type & L'Ȁ') != L'\0') {
          wVar4 = archive_mstring_get_mbs_l(&paVar7->name,&name,&len,local_50);
          if (wVar4 != L'\0') {
            return L'\xffffffff';
          }
          if (iVar8 != 0) {
            *p = ',';
            p = p + 1;
          }
          wVar4 = L'\xffffffff';
          if (((uint)flags >> 10 & 1) != 0) {
            wVar4 = paVar7->id;
          }
          append_entry(&p,local_48,paVar7->tag,name,paVar7->permset,wVar4);
          iVar8 = iVar8 + 1;
        }
      }
    }
    psVar2 = local_38;
    __s = local_58->acl_text;
    *local_40 = __s;
    if (local_38 != (size_t *)0x0) {
      sVar9 = strlen(__s);
      *psVar2 = sVar9;
    }
  }
  return L'\0';
}

Assistant:

int
archive_acl_text_l(struct archive_acl *acl, int flags,
    const char **acl_text, size_t *acl_text_len,
    struct archive_string_conv *sc)
{
	int count;
	size_t length;
	const char *name;
	const char *prefix;
	char separator;
	struct archive_acl_entry *ap;
	size_t len;
	int id, r;
	char *p;

	if (acl->acl_text != NULL) {
		free (acl->acl_text);
		acl->acl_text = NULL;
	}

	*acl_text = NULL;
	if (acl_text_len != NULL)
		*acl_text_len = 0;
	separator = ',';
	count = 0;
	length = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & flags) != 0) {
			count++;
			if ((flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) &&
			    (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT))
				length += 8; /* "default:" */
			length += 5; /* tag name */
			length += 1; /* colon */
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			if (len > 0 && name != NULL)
				length += len;
			else
				length += sizeof(uid_t) * 3 + 1;
			length ++; /* colon */
			length += 3; /* rwx */
			length += 1; /* colon */
			length += max(sizeof(uid_t), sizeof(gid_t)) * 3 + 1;
			length ++; /* newline */
		}
		ap = ap->next;
	}

	if (count > 0 && ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)) {
		length += 10; /* "user::rwx\n" */
		length += 11; /* "group::rwx\n" */
		length += 11; /* "other::rwx\n" */
	}

	if (count == 0)
		return (0);

	/* Now, allocate the string and actually populate it. */
	p = acl->acl_text = (char *)malloc(length);
	if (p == NULL)
		return (-1);
	count = 0;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_USER_OBJ, NULL,
		    acl->mode & 0700, -1);
		*p++ = ',';
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_GROUP_OBJ, NULL,
		    acl->mode & 0070, -1);
		*p++ = ',';
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_OTHER, NULL,
		    acl->mode & 0007, -1);
		count += 3;

		for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) == 0)
				continue;
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			*p++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry(&p, NULL, ap->tag, name,
			    ap->permset, id);
			count++;
		}
	}


	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
		if (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT)
			prefix = "default:";
		else
			prefix = NULL;
		count = 0;
		for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) == 0)
				continue;
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			if (count > 0)
				*p++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry(&p, prefix, ap->tag,
			    name, ap->permset, id);
			count ++;
		}
	}

	*acl_text = acl->acl_text;
	if (acl_text_len != NULL)
		*acl_text_len = strlen(acl->acl_text);
	return (0);
}